

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

size_t vectorread8<MemoryReader*>(MemoryReader *rd,ByteVector *v,size_t n)

{
  int iVar1;
  reference pvVar2;
  undefined4 extraout_var;
  size_type sVar3;
  size_t nr;
  size_t n_local;
  ByteVector *v_local;
  MemoryReader *rd_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(v,n);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](v,0);
  iVar1 = (*(rd->super_ReadWriter)._vptr_ReadWriter[2])(rd,pvVar2,n);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(v,CONCAT44(extraout_var,iVar1))
  ;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(v);
  return sVar3;
}

Assistant:

size_t vectorread8(PTR rd, ByteVector& v, size_t n)
{
	v.resize(n);
	size_t nr= rd->read((uint8_t*)&v[0], n);
	v.resize(nr);
	return v.size();
}